

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dcm-bias-estimation.cpp
# Opt level: O3

int testUnidimDcmBiasEstimator(int errorCode)

{
  undefined8 uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  DstEvaluatorType dstEvaluator;
  double *__s;
  undefined8 *puVar5;
  double *__s_00;
  void *__s_01;
  double *__s_02;
  double *__s_03;
  void *__s_04;
  void *__s_05;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *pCVar6;
  Matrix<double,_6,_1,_0,_6,_1> *pMVar7;
  ostream *poVar8;
  value_type_conflict *__val;
  int iVar9;
  value_type_conflict *__val_1;
  value_type_conflict *__val_2;
  long lVar10;
  double dVar11;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> local_458;
  double *local_438;
  long local_430;
  Vector6 log_k;
  IndexedVectorArray log;
  UnidimLipmDcmEstimator est;
  
  __s = (double *)operator_new(0x2ee00);
  memset(__s,0,0x2ee00);
  puVar5 = (undefined8 *)operator_new(0x2ee00);
  memset(puVar5,0,0x2ee00);
  __s_00 = (double *)operator_new(0x2ee00);
  memset(__s_00,0,0x2ee00);
  dVar11 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(2.0,0.0);
  *__s = dVar11;
  uVar1 = stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.01,0.0);
  *puVar5 = uVar1;
  dVar11 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
  dVar4 = *__s * 1.6060915267313265 + dVar11;
  *__s_00 = dVar4;
  lVar10 = 1;
  do {
    __s[lVar10] = (__s[lVar10 + -1] - dVar4) * 0.01649915822768611 + __s[lVar10 + -1];
    dVar4 = (double)puVar5[lVar10 + -1];
    dVar2 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar
                              (2.5e-05,0.0);
    puVar5[lVar10] = dVar4 + dVar2;
    dVar2 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
    dVar4 = __s[lVar10 + -1];
    dVar3 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.05,0.0);
    dVar11 = dVar11 + dVar2;
    dVar4 = dVar4 * 1.6060915267313265 + dVar3 + dVar11;
    __s_00[lVar10] = dVar4;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 24000);
  __s_01 = operator_new(0x2ee00);
  memset(__s_01,0,0x2ee00);
  __s_02 = (double *)operator_new(0x2ee00);
  memset(__s_02,0,0x2ee00);
  __s_03 = (double *)operator_new(0x2ee00);
  lVar10 = 0;
  memset(__s_03,0,0x2ee00);
  do {
    dVar11 = *(double *)((long)__s + lVar10);
    dVar4 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.005,0.0);
    dVar11 = dVar11 + dVar4;
    *(double *)((long)__s_01 + lVar10) = dVar11;
    *(double *)((long)__s_02 + lVar10) = dVar11 + *(double *)((long)puVar5 + lVar10);
    dVar11 = *(double *)((long)__s_00 + lVar10);
    dVar4 = (double)stateObservation::tools::ProbabilityLawSimulation::getGaussianScalar(0.001,0.0);
    *(double *)((long)__s_03 + lVar10) = dVar11 + dVar4;
    lVar10 = lVar10 + 8;
  } while (lVar10 != 0x2ee00);
  __s_04 = operator_new(0x2ee00);
  memset(__s_04,0,0x2ee00);
  __s_05 = operator_new(0x2ee00);
  memset(__s_05,0,0x2ee00);
  stateObservation::UnidimLipmDcmEstimator::UnidimLipmDcmEstimator
            (&est,0.005,3.2998316455372216,0.002,0.0,0.0,0.0,0.01,0.005,0.01,0.01);
  stateObservation::UnidimLipmDcmEstimator::resetWithInputs
            (*__s_02,*__s_03,SUB81(&est,0),0.005,0.001,0.0,0.01,0.01);
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  log.k_ = 0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  log.v_.
  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::_M_initialize_map(&log.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ,0);
  local_430 = (long)__s_01 + 8;
  local_438 = __s + 1;
  iVar9 = 1;
  lVar10 = 0;
  do {
    stateObservation::UnidimLipmDcmEstimator::setInputs
              (*(double *)((long)__s_02 + lVar10 + 8),*(double *)((long)__s_03 + lVar10 + 8));
    stateObservation::ZeroDelayObserver::getMeasurementTime();
    stateObservation::ZeroDelayObserver::getEstimatedState((long)&log_k);
    if (log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1]
        != 9.88131291682493e-324) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 2, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 2, 1>]"
                   );
    }
    free((void *)log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
                 .array[0]);
    uVar1 = stateObservation::UnidimLipmDcmEstimator::getBias();
    *(undefined8 *)((long)__s_05 + lVar10 + 8) = uVar1;
    dVar11 = (double)stateObservation::UnidimLipmDcmEstimator::getUnbiasedDCM();
    *(double *)((long)__s_04 + lVar10 + 8) = dVar11;
    if (NAN(dVar11)) goto LAB_00103cfc;
    log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         (double)iVar9;
    local_458.m_xpr = &log_k;
    local_458.m_row = 0;
    local_458.m_col = 1;
    local_458.m_currentBlockRows = 1;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (&local_458,(Scalar *)((long)__s_05 + lVar10 + 8));
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar6,(Scalar *)((long)puVar5 + lVar10 + 8));
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar6,(Scalar *)((long)__s_04 + lVar10 + 8));
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                       (pCVar6,(Scalar *)(local_430 + lVar10));
    Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
              (pCVar6,(Scalar *)((long)local_438 + lVar10));
    if ((local_458.m_currentBlockRows + local_458.m_row != 6) || (local_458.m_col != 1)) {
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 6, 1>>::finished() [MatrixType = Eigen::Matrix<double, 6, 1>]"
                   );
    }
    local_458.m_xpr = (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
    local_458.m_row = 0;
    pMVar7 = (Matrix<double,_6,_1,_0,_6,_1> *)malloc(0x30);
    if (((ulong)pMVar7 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pMVar7 == (Matrix<double,_6,_1,_0,_6,_1> *)0x0) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = std::ios::widen;
      __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_458.m_row = 6;
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[4]
         = log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [4];
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[5]
         = log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [5];
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[2]
         = log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [2];
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[3]
         = log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [3];
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[0]
         = log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [0];
    (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array[1]
         = log_k.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
           [1];
    local_458.m_xpr = pMVar7;
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&log.v_,(value_type *)&local_458);
    free(local_458.m_xpr);
    lVar10 = lVar10 + 8;
    iVar9 = iVar9 + 1;
  } while (lVar10 != 0x2edf8);
  dVar11 = 0.0;
  lVar10 = 0;
  do {
    dVar11 = dVar11 + ABS(*(double *)((long)__s_05 + lVar10 * 8 + 0x2edb0) -
                          (double)puVar5[lVar10 + 0x5db6]) +
                      ABS(*(double *)((long)__s_04 + lVar10 * 8 + 0x2edb0) - __s[lVar10 + 0x5db6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Sum of error on the 10 last samples = ",0x26);
  poVar8 = std::ostream::_M_insert<double>(dVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (dVar11 <= 0.07) {
    errorCode = 0;
  }
LAB_00103cfc:
  std::
  deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~deque(&log.v_);
  stateObservation::UnidimLipmDcmEstimator::~UnidimLipmDcmEstimator(&est);
  operator_delete(__s_05);
  operator_delete(__s_04);
  operator_delete(__s_03);
  operator_delete(__s_02);
  operator_delete(__s_01);
  operator_delete(__s_00);
  operator_delete(puVar5);
  operator_delete(__s);
  return errorCode;
}

Assistant:

int testUnidimDcmBiasEstimator(int errorCode)
{
  double w0 = sqrt(cst::gravityConstant / 0.9);
  double dt = 0.005;

  double biasDriftPerSecondStd = 0.005;
  double zmpMeasurementErrorStd = 0.001;
  double dcmMeasurementErrorStd = 0.005;

  int signallength = int(120. / dt);

  ///////////////////////////////////////
  /// Build the ground truth signals
  ///////////////////////////////////////
  typedef tools::ProbabilityLawSimulation ran;
  std::vector<double> dcm(signallength), bias(signallength), zmp(signallength);

  /// set the desired exponential convergence of the DCM
  double lambda = 2;

  /// initialize the dcm and bias to a random value
  dcm[0] = ran::getGaussianScalar(2, 0);
  double initBiasstd = 0.01;

  bias[0] = ran::getGaussianScalar(0.01, 0);
  double deviation = ran::getGaussianScalar(0.05, 0);
  zmp[0] = (lambda / w0 + 1) * dcm[0] + deviation;

  for(int i = 0; i < signallength - 1; ++i)
  {
    /// dcm dynamics
    dcm[i + 1] = dcm[i] + dt * w0 * (dcm[i] - zmp[i]);
    /// drift
    bias[i + 1] = bias[i] + ran::getGaussianScalar(biasDriftPerSecondStd * dt);
    /// set a noisy zmp to create  bounded drift of the DCM
    deviation += ran::getGaussianScalar(0.05, 0);
    zmp[i + 1] = (lambda / w0 + 1) * dcm[i] + ran::getGaussianScalar(0.05, 0) + deviation;
  }

  /////////////////////////////////
  /// Build the measurements
  /////////////////////////////////
  std::vector<double> dcm_m_unbiased(signallength), dcm_m(signallength), zmp_m(signallength);

  for(int i = 0; i < signallength; ++i)
  {
    dcm_m_unbiased[i] = dcm[i] + ran::getGaussianScalar(dcmMeasurementErrorStd);
    dcm_m[i] = dcm_m_unbiased[i] + bias[i];
    zmp_m[i] = zmp[i] + ran::getGaussianScalar(zmpMeasurementErrorStd);
  }

  /////////////////////////////////
  /// Run the estimator
  /////////////////////////////////
  std::vector<double> dcm_hat(signallength), bias_hat(signallength);

  double initbias = 0;

  UnidimLipmDcmEstimator est(dt, w0);

  est.resetWithInputs(dcm_m[0], zmp_m[0], biasDriftPerSecondStd, dcmMeasurementErrorStd, zmpMeasurementErrorStd,
                      initbias, initBiasstd);

  IndexedVectorArray log;

  for(int i = 1; i < signallength; i++)
  {
    est.setInputs(dcm_m[i], zmp_m[i]);
    est.update();
    bias_hat[i] = est.getBias();
    dcm_hat[i] = est.getUnbiasedDCM();

    /// NaN detection
    if(dcm_hat[i] != dcm_hat[i])
    {
      return errorCode;
    }

    Vector6 log_k;

    log_k << i, bias_hat[i], bias[i], dcm_hat[i], dcm_m_unbiased[i], dcm[i];
    log.pushBack(log_k);
  }

  /// uncomment the following line to have a bit of a log
  // log.writeInFile("dcm.txt");

  /////////////////////////////////
  /// Check the rror
  /////////////////////////////////
  double error = 0;

  for(int i = signallength - 10; i < signallength; ++i)
  {
    error += fabs(dcm_hat[i] - dcm[i]) + fabs(bias_hat[i] - bias[i]);
  }

  std::cout << "Sum of error on the 10 last samples = " << error << std::endl;

  if(error > 0.07)
  {
    return errorCode;
  }
  else
  {
    return 0;
  }
}